

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyser.cpp
# Opt level: O2

void __thiscall SemanticAnalyser::visit(SemanticAnalyser *this,AssignmentNode *node)

{
  bool bVar1;
  element_type *peVar2;
  optional<TypeName> *poVar3;
  TypeName *__k;
  mapped_type *__rhs;
  optional<std::reference_wrapper<Symbol>_> oVar4;
  string name;
  VariableAnalyser analyser;
  TypeChecker typeChecker;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  VariableAnalyser local_b0;
  TypeChecker local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string((string *)&local_d0,(string *)&node->name_);
  oVar4 = SymbolTable::lookup(&this->symbols_,&local_d0,0);
  if (((undefined1  [16])
       oVar4.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
       super__Optional_payload_base<std::reference_wrapper<Symbol>_> & (undefined1  [16])0x1) ==
      (undefined1  [16])0x0) {
    std::operator+(&local_f0,"Assignment to undeclared variable ",&local_d0);
    reportError(&local_f0,(Node *)node);
  }
  VariableAnalyser::VariableAnalyser(&local_b0);
  (**(code **)(*(long *)oVar4.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>.
                        _M_payload.super__Optional_payload_base<std::reference_wrapper<Symbol>_>.
                        _M_payload + 0x10))
            (oVar4.super__Optional_base<std::reference_wrapper<Symbol>,_true,_true>._M_payload.
             super__Optional_payload_base<std::reference_wrapper<Symbol>_>._M_payload,&local_b0);
  if (local_b0.symbolValid_ == false) {
    std::operator+(&local_f0,"Assignment to a non-variable symbol ",&local_d0);
    reportError(&local_f0,(Node *)node);
  }
  if ((((ulong)local_b0.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
               super__Optional_payload_base<TypeName> & 0x1ffffffff) == 0x100000001) &&
     (node->operator_ != Assign)) {
    std::operator+(&local_f0,"Cannot perform arithmetic operation on function variable ",&local_d0);
    reportError(&local_f0,(Node *)node);
  }
  peVar2 = (node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*(peVar2->super_Node)._vptr_Node[2])(peVar2,this);
  local_98.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_001d0488;
  local_98.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
  super__Optional_payload_base<TypeName>._M_engaged = false;
  local_98.symbols_ = &this->symbols_;
  (*(((node->value_).super___shared_ptr<ExpressionNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    super_Node)._vptr_Node[2])();
  poVar3 = TypeChecker::getType(&local_98);
  if ((poVar3->super__Optional_base<TypeName,_true,_true>)._M_payload.
      super__Optional_payload_base<TypeName>._M_engaged == true) {
    poVar3 = TypeChecker::getType(&local_98);
    bVar1 = (poVar3->super__Optional_base<TypeName,_true,_true>)._M_payload.
            super__Optional_payload_base<TypeName>._M_engaged;
    if (bVar1 == local_b0.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
                 super__Optional_payload_base<TypeName>._M_engaged && bVar1 == true) {
      if ((poVar3->super__Optional_base<TypeName,_true,_true>)._M_payload.
          super__Optional_payload_base<TypeName>._M_payload._M_value ==
          local_b0.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
          super__Optional_payload_base<TypeName>._M_payload) goto LAB_00146409;
    }
    else if (bVar1 == local_b0.type_.super__Optional_base<TypeName,_true,_true>._M_payload.
                      super__Optional_payload_base<TypeName>._M_engaged) goto LAB_00146409;
    poVar3 = TypeChecker::getType(&local_98);
    __k = std::optional<TypeName>::value(poVar3);
    __rhs = std::__detail::
            _Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::at((_Map_base<TypeName,_std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_TypeName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<TypeName>,_std::hash<TypeName>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  *)&TypeNameStrings_abi_cxx11_,__k);
    std::operator+(&local_80,"Cannot assign value of type ",__rhs);
    std::operator+(&local_60,&local_80," to variable ");
    std::operator+(&local_40,&local_60,&local_d0);
    std::operator+(&local_f0,&local_40,"!");
    reportError(&local_f0,(Node *)node);
  }
LAB_00146409:
  std::__cxx11::string::~string((string *)&local_d0);
  return;
}

Assistant:

void SemanticAnalyser::visit(const AssignmentNode& node) 
{
  const auto name = node.getName();
  const auto symbol = symbols_.lookup(name);
  if(!symbol)
    reportError("Assignment to undeclared variable " + name, node);

  VariableAnalyser analyser{};
  symbol.value().get().accept(analyser);
  if(!analyser.isSymbolValid())
    reportError("Assignment to a non-variable symbol " + name, node);

  if(analyser.getType() == TypeName::Function && node.getOperation() != AssignmentOperator::Assign)
    reportError("Cannot perform arithmetic operation on function variable " + name, node);

  node.getValue()->accept(*this);

  TypeChecker typeChecker{symbols_};
  node.getValue()->accept(typeChecker);

  // Type checker is not able to deduce expression's type when variable was called
  // and in that case getType has no value.
  if(typeChecker.getType().has_value() && typeChecker.getType() != analyser.getType())
    reportError("Cannot assign value of type " + 
      TypeNameStrings.at(typeChecker.getType().value()) + " to variable " + name + "!", node);
}